

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::ValueView::ValueView(ValueView *this,ValueView *param_1)

{
  StringDictionary *pSVar1;
  
  Type::Type(&this->type,&param_1->type);
  pSVar1 = param_1->stringDictionary;
  this->data = param_1->data;
  this->stringDictionary = pSVar1;
  return;
}

Assistant:

ValueView (const ValueView&) = default;